

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

optional<double> anon_unknown.dwarf_95a2a9::qConvertToRealNumber(Private *d)

{
  int iVar1;
  ushort uVar2;
  qulonglong qVar3;
  bool *unaff_RBX;
  ulong uVar4;
  long in_FS_OFFSET;
  _Storage<double,_true> extraout_XMM0_Qa;
  _Storage<double,_true> _Var5;
  undefined1 auVar6 [16];
  optional<long_long> oVar7;
  optional<double> oVar8;
  bool ok;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = true;
  iVar1 = *(int *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 0xc);
  if (iVar1 < 0x26) {
    switch(iVar1) {
    case 4:
    case 7:
    case 8:
    case 9:
switchD_002d1530_caseD_4:
      unaff_RBX = (bool *)0x0;
      oVar7 = qConvertToNumber(d,false);
      _Var5 = extraout_XMM0_Qa;
      if (((undefined1  [16])
           oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
         ) {
LAB_002d167a:
        uVar4 = 0;
        goto LAB_002d15d7;
      }
      _Var5._M_value =
           (double)oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
                   super__Optional_payload_base<long_long>._M_payload;
      break;
    case 6:
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      _Var5 = *(_Storage<double,_true> *)d;
      break;
    case 10:
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      unaff_RBX = &local_11;
      _Var5._M_value = QString::toDouble((QString *)d,unaff_RBX);
      if (local_11 == false) goto LAB_002d167a;
      break;
    default:
      if (2 < iVar1 - 0x23U) goto switchD_002d1530_caseD_4;
    case 3:
    case 5:
switchD_002d1530_caseD_3:
      qVar3 = qMetaTypeUNumber(d);
      auVar6._8_4_ = (int)(qVar3 >> 0x20);
      auVar6._0_8_ = qVar3;
      auVar6._12_4_ = 0x45300000;
      _Var5._M_value =
           (auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)qVar3) - 4503599627370496.0);
    }
  }
  else if (iVar1 < 0x38) {
    if (iVar1 == 0x26) {
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      _Var5._M_value = (double)*(float *)&d->data;
    }
    else {
      if (iVar1 != 0x2d) {
        if (iVar1 == 0x35) {
          if ((d->field_0x18 & 1) != 0) {
            d = (Private *)
                ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                (long)((d->data).shared)->offset);
          }
          uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
          if (*(int *)((long)d + 0x10) == 0) {
            _Var5._M_value = (double)*(_Storage<double,_true> *)d;
          }
          else {
            _Var5._M_value = 0.0;
            if (*(int *)((long)d + 0x10) == 0x202) {
              _Var5 = *(_Storage<double,_true> *)d;
            }
          }
          goto LAB_002d15d7;
        }
        goto switchD_002d1530_caseD_4;
      }
      if ((d->field_0x18 & 1) != 0) {
        d = (Private *)
            ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
            (long)((d->data).shared)->offset);
      }
      _Var5._M_value = QJsonValue::toDouble((QJsonValue *)d,0.0);
    }
  }
  else {
    if (iVar1 - 0x38U < 2) goto switchD_002d1530_caseD_3;
    if (iVar1 != 0x3f) goto switchD_002d1530_caseD_4;
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    uVar2 = *(ushort *)&d->data >> 10;
    _Var5._M_value =
         (double)(float)(qfloat16::exponenttable[uVar2] +
                        qfloat16::mantissatable
                        [(*(ushort *)&d->data & 0x3ff) + qfloat16::offsettable[uVar2]]);
  }
  uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
LAB_002d15d7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  oVar8.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = uVar4 & 0xffffffff;
  oVar8.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._M_value = _Var5._M_value;
  return (optional<double>)
         oVar8.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

static std::optional<double> qConvertToRealNumber(const QVariant::Private *d)
{
    bool ok;
    switch (d->typeInterface()->typeId) {
    case QMetaType::QString:
        if (double r = d->get<QString>().toDouble(&ok); ok)
            return r;
        return std::nullopt;
    case QMetaType::Double:
        return d->get<double>();
    case QMetaType::Float:
        return double(d->get<float>());
    case QMetaType::Float16:
        return double(d->get<qfloat16>());
    case QMetaType::ULongLong:
    case QMetaType::UInt:
    case QMetaType::UChar:
    case QMetaType::Char16:
    case QMetaType::Char32:
    case QMetaType::UShort:
    case QMetaType::ULong:
        return double(qMetaTypeUNumber(d));
    case QMetaType::QCborValue:
        return d->get<QCborValue>().toDouble();
    case QMetaType::QJsonValue:
        return d->get<QJsonValue>().toDouble();
    default:
        // includes enum conversion as well as invalid types
        if (std::optional<qlonglong> l = qConvertToNumber(d))
            return double(*l);
        return std::nullopt;
    }
}